

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::unary<double,_tcu::Matrix<double,_3,_3>_>::call
          (unary<double,_tcu::Matrix<double,_3,_3>_> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  undefined8 uVar1;
  Matrix<double,_3,_3> arg;
  Matrix<double,_3,_3> MStack_68;
  
  tcu::Matrix<double,_3,_3>::Matrix(&MStack_68);
  unpack<tcu::Matrix<double,_3,_3>_>::get(argument_src,&MStack_68);
  uVar1 = (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&MStack_68);
  *(undefined8 *)result_dst = uVar1;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}